

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarking.cpp
# Opt level: O2

void perf_get_interest_points
               (_func_void_fasthessian_ptr_vector<interest_point,_std::allocator<interest_point>_>_ptr
                *function,fasthessian *fh,benchmark_data *data)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  uint64_t uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 in_ZMM2 [64];
  double local_98;
  double local_90;
  vector<double,_std::allocator<double>_> cycleslist;
  vector<interest_point,_std::allocator<interest_point>_> dummy_interest_points_1;
  
  lVar7 = 100;
  dVar10 = 1.0;
  do {
    cycleslist.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    lVar7 = (long)(dVar10 * (double)lVar7);
    cycleslist.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    cycleslist.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    std::vector<interest_point,_std::allocator<interest_point>_>::reserve
              ((vector<interest_point,_std::allocator<interest_point>_> *)&cycleslist,
               data->num_interest_points * lVar7);
    cpuid_basic_info(0);
    uVar1 = rdtsc();
    lVar5 = lVar7;
    while (bVar8 = lVar5 != 0, lVar5 = lVar5 + -1, bVar8) {
      (*function)(fh,(vector<interest_point,_std::allocator<interest_point>_> *)&cycleslist);
    }
    uVar2 = rdtsc();
    cpuid_basic_info(0);
    if (cycleslist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        cycleslist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start) {
      cycleslist.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish = cycleslist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
    }
    auVar9 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,
                                (((ulong)(uint)-(int)(uVar1 >> 0x20) << 0x20) - (uVar1 & 0xffffffff)
                                ) + (uVar2 & 0xffffffff) + (uVar2 & 0xffffffff00000000));
    local_90 = auVar9._0_8_;
    dVar10 = 100000000.0 / local_90;
    std::_Vector_base<interest_point,_std::allocator<interest_point>_>::~_Vector_base
              ((_Vector_base<interest_point,_std::allocator<interest_point>_> *)&cycleslist);
  } while (2.0 < dVar10);
  cycleslist.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  cycleslist.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  cycleslist.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98 = 0.0;
  for (lVar5 = 0; lVar5 != 10; lVar5 = lVar5 + 1) {
    dummy_interest_points_1.super__Vector_base<interest_point,_std::allocator<interest_point>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    dummy_interest_points_1.super__Vector_base<interest_point,_std::allocator<interest_point>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    dummy_interest_points_1.super__Vector_base<interest_point,_std::allocator<interest_point>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<interest_point,_std::allocator<interest_point>_>::reserve
              ((vector<interest_point,_std::allocator<interest_point>_> *)
               &dummy_interest_points_1.
                super__Vector_base<interest_point,_std::allocator<interest_point>_>,
               data->num_interest_points * lVar7);
    cpuid_basic_info(0);
    uVar1 = rdtsc();
    lVar6 = lVar7;
    while (bVar8 = lVar6 != 0, lVar6 = lVar6 + -1, bVar8) {
      (*function)(fh,(vector<interest_point,_std::allocator<interest_point>_> *)
                     &dummy_interest_points_1.
                      super__Vector_base<interest_point,_std::allocator<interest_point>_>);
    }
    uVar2 = rdtsc();
    cpuid_basic_info(0);
    if (dummy_interest_points_1.super__Vector_base<interest_point,_std::allocator<interest_point>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        dummy_interest_points_1.super__Vector_base<interest_point,_std::allocator<interest_point>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      dummy_interest_points_1.super__Vector_base<interest_point,_std::allocator<interest_point>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           dummy_interest_points_1.
           super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    auVar9 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,
                                (((ulong)(uint)-(int)(uVar1 >> 0x20) << 0x20) - (uVar1 & 0xffffffff)
                                ) + (uVar2 & 0xffffffff) + (uVar2 & 0xffffffff00000000));
    dVar10 = auVar9._0_8_ / (double)lVar7;
    local_90 = dVar10;
    std::vector<double,_std::allocator<double>_>::push_back(&cycleslist,&local_90);
    local_98 = local_98 + dVar10;
    std::_Vector_base<interest_point,_std::allocator<interest_point>_>::~_Vector_base
              (&dummy_interest_points_1.
                super__Vector_base<interest_point,_std::allocator<interest_point>_>);
  }
  lVar7 = data->num_flops;
  local_90 = local_98 / 10.0;
  std::
  __sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (cycleslist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,
             cycleslist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish);
  auVar14._8_8_ = 0x3fdfffffffffffff;
  auVar14._0_8_ = 0x3fdfffffffffffff;
  auVar11._0_8_ = ((double)lVar7 * 100.0) / (local_98 / 10.0);
  auVar11._8_8_ = 0;
  auVar3._8_8_ = 0x8000000000000000;
  auVar3._0_8_ = 0x8000000000000000;
  auVar9 = vpternlogq_avx512vl(auVar14,auVar11,auVar3,0xf8);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = auVar11._0_8_ + auVar9._0_8_;
  auVar3 = vroundsd_avx(auVar12,auVar12,0xb);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_90;
  auVar9 = vmovhps_avx(auVar13,*cycleslist.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
  auVar9 = vcvttpd2uqq_avx512vl(auVar9);
  data->avg_cycles = auVar9._0_8_;
  data->min_cycles = auVar9._8_8_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = cycleslist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1];
  uVar4 = vcvttsd2usi_avx512f(auVar9);
  data->max_cycles = uVar4;
  data->flops_per_cycle = auVar3._0_8_ / 100.0;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&cycleslist.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void perf_get_interest_points(void (*function)(struct fasthessian *, std::vector<struct interest_point> *),
                              struct fasthessian *fh, struct benchmark_data &data) {
    double cycles = 0.;
    long num_runs = 100;
    double multiplier = 1;
    uint64_t start, end;

#ifdef WARM_UP
    // Warm-up phase: we determine a number of executions that allows
    // the code to be executed for at least CYCLES_REQUIRED cycles.
    // This helps excluding timing overhead when measuring small runtimes.
    do {
        num_runs = num_runs * multiplier;
        std::vector<struct interest_point> dummy_interest_points;
        dummy_interest_points.reserve(num_runs * data.num_interest_points);

        start = start_tsc();
        for (size_t i = 0; i < num_runs; i++) {
            (*function)(fh, &dummy_interest_points);
        }
        end = stop_tsc(start);
        dummy_interest_points.clear();

        cycles = (double)end;
        multiplier = (CYCLES_REQUIRED) / (cycles);

    } while (multiplier > 2);
#endif

    std::vector<double> cycleslist;

    // Actual performance measurements repeated REP times.
    // We simply store all results and compute medians during post-processing.
    double total_cycles = 0;
    for (size_t j = 0; j < REP; j++) {
        std::vector<struct interest_point> dummy_interest_points;
        dummy_interest_points.reserve(num_runs * data.num_interest_points);

        start = start_tsc();

        for (size_t i = 0; i < num_runs; ++i) {
            (*function)(fh, &dummy_interest_points);
        }
        end = stop_tsc(start);

        dummy_interest_points.clear();

        cycles = ((double)end) / num_runs;
        total_cycles += cycles;

        cycleslist.push_back(cycles);
    }
    total_cycles /= REP;

    cycles = total_cycles;  // cyclesList.front();
    double flops_per_cycle = round((100.0 * data.num_flops) / cycles) / 100.0;
    std::sort(cycleslist.begin(), cycleslist.end());
    data.avg_cycles = (uint64_t)cycles;
    data.min_cycles = (uint64_t)cycleslist.front();
    data.max_cycles = (uint64_t)cycleslist.back();
    data.flops_per_cycle = flops_per_cycle;
}